

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Catch::TestCaseTracking::TrackerBase::TrackerHasName::operator()
          (TrackerHasName *this,Ptr<Catch::TestCaseTracking::ITracker> *tracker)

{
  int iVar1;
  bool bVar2;
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  (*(tracker->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
    _vptr_NonCopyable[4])(&local_38);
  if (local_30 == (this->m_name)._M_string_length) {
    if (local_30 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_38,(this->m_name)._M_dataplus._M_p,local_30);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return bVar2;
}

Assistant:

bool operator ()( Ptr<ITracker> const& tracker ) {
                return tracker->name() == m_name;
            }